

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall asl::Array<asl::Socket>::free(Array<asl::Socket> *this,void *__ptr)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  Socket *pSVar5;
  long lVar6;
  
  pSVar5 = this->_a;
  lVar6 = (long)*(int *)&pSVar5[-2].super_SmartObject._p;
  if (lVar6 != 0) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)((long)&(pSVar5->super_SmartObject)._p + lVar4);
      if (lVar2 != 0) {
        LOCK();
        piVar1 = (int *)(lVar2 + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (plVar3 = *(long **)((long)&(pSVar5->super_SmartObject)._p + lVar4),
           plVar3 != (long *)0x0)) {
          (**(code **)(*plVar3 + 8))();
        }
      }
      lVar4 = lVar4 + 8;
    } while (lVar6 * 8 != lVar4);
    pSVar5 = this->_a;
  }
  ::free(pSVar5 + -2);
  this->_a = (Socket *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}